

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decaf.c
# Opt level: O3

void sub_niels_from_pt(decaf_448_point_s *d,niels_s *e,int before_double)

{
  gf_448_s *cs;
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint64x2_t *aa;
  uint64x2_t lo;
  gf_448_t b;
  gf_448_t a;
  gf_448_t c;
  gf_448_s local_120;
  gf_448_s local_e0;
  gf_448_s local_a0;
  
  cs = d->y;
  lVar6 = 0;
  do {
    plVar2 = (long *)((long)d->y[0].limb + lVar6);
    lVar4 = plVar2[1];
    plVar1 = (long *)((long)d->x[0].limb + lVar6);
    lVar5 = plVar1[1];
    *(long *)((long)local_120.limb + lVar6) = *plVar2 - *plVar1;
    *(long *)((long)local_120.limb + lVar6 + 8) = lVar4 - lVar5;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  local_120.limb[0] = local_120.limb[0] + 0x1fffffffffffffe;
  local_120.limb[1] = local_120.limb[1] + 0x1fffffffffffffe;
  local_120.limb[2] = local_120.limb[2] + 0x1fffffffffffffe;
  local_120.limb[3] = local_120.limb[3] + 0x1fffffffffffffe;
  local_120.limb[4] = local_120.limb[4] + 0x1fffffffffffffc;
  local_120.limb[5] = local_120.limb[5] + 0x1fffffffffffffe;
  local_120.limb[6] = local_120.limb[6] + 0x1fffffffffffffe;
  local_120.limb[7] = local_120.limb[7] + 0x1fffffffffffffe;
  gf_448_mul(&local_e0,e->b,&local_120);
  lVar6 = 0;
  do {
    plVar2 = (long *)((long)d->y[0].limb + lVar6);
    lVar4 = plVar2[1];
    plVar1 = (long *)((long)d->x[0].limb + lVar6);
    lVar5 = plVar1[1];
    *(long *)((long)local_120.limb + lVar6) = *plVar2 + *plVar1;
    *(long *)((long)local_120.limb + lVar6 + 8) = lVar4 + lVar5;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  gf_448_mul(cs,e->a,&local_120);
  gf_448_mul(d->x,e->c,d->t);
  lVar6 = 0;
  do {
    plVar1 = (long *)((long)d->y[0].limb + lVar6);
    lVar4 = plVar1[1];
    lVar5 = *(long *)((long)local_e0.limb + lVar6 + 8);
    *(long *)((long)local_a0.limb + lVar6) = *plVar1 + *(long *)((long)local_e0.limb + lVar6);
    *(long *)((long)local_a0.limb + lVar6 + 8) = lVar4 + lVar5;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  lVar6 = 0;
  do {
    plVar1 = (long *)((long)d->y[0].limb + lVar6);
    lVar4 = plVar1[1];
    lVar5 = *(long *)((long)local_e0.limb + lVar6 + 8);
    *(long *)((long)local_120.limb + lVar6) = *plVar1 - *(long *)((long)local_e0.limb + lVar6);
    *(long *)((long)local_120.limb + lVar6 + 8) = lVar4 - lVar5;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  local_120.limb[0] = local_120.limb[0] + 0x1fffffffffffffe;
  local_120.limb[1] = local_120.limb[1] + 0x1fffffffffffffe;
  local_120.limb[2] = local_120.limb[2] + 0x1fffffffffffffe;
  local_120.limb[3] = local_120.limb[3] + 0x1fffffffffffffe;
  local_120.limb[4] = local_120.limb[4] + 0x1fffffffffffffc;
  local_120.limb[5] = local_120.limb[5] + 0x1fffffffffffffe;
  local_120.limb[6] = local_120.limb[6] + 0x1fffffffffffffe;
  local_120.limb[7] = local_120.limb[7] + 0x1fffffffffffffe;
  lVar6 = 0;
  do {
    plVar1 = (long *)((long)d->x[0].limb + lVar6);
    lVar4 = plVar1[1];
    plVar3 = (long *)((long)d->z[0].limb + lVar6);
    lVar5 = plVar3[1];
    plVar2 = (long *)((long)d->y[0].limb + lVar6);
    *plVar2 = *plVar1 + *plVar3;
    plVar2[1] = lVar4 + lVar5;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  lVar6 = 0;
  do {
    plVar2 = (long *)((long)d->z[0].limb + lVar6);
    lVar4 = plVar2[1];
    plVar1 = (long *)((long)d->x[0].limb + lVar6);
    lVar5 = plVar1[1];
    *(long *)((long)local_e0.limb + lVar6) = *plVar2 - *plVar1;
    *(long *)((long)local_e0.limb + lVar6 + 8) = lVar4 - lVar5;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  local_e0.limb[0] = local_e0.limb[0] + 0x1fffffffffffffe;
  local_e0.limb[1] = local_e0.limb[1] + 0x1fffffffffffffe;
  local_e0.limb[2] = local_e0.limb[2] + 0x1fffffffffffffe;
  local_e0.limb[3] = local_e0.limb[3] + 0x1fffffffffffffe;
  local_e0.limb[4] = local_e0.limb[4] + 0x1fffffffffffffc;
  local_e0.limb[5] = local_e0.limb[5] + 0x1fffffffffffffe;
  local_e0.limb[6] = local_e0.limb[6] + 0x1fffffffffffffe;
  local_e0.limb[7] = local_e0.limb[7] + 0x1fffffffffffffe;
  gf_448_mul(d->z,&local_e0,cs);
  gf_448_mul(d->x,cs,&local_120);
  gf_448_mul(cs,&local_e0,&local_a0);
  if (before_double == 0) {
    gf_448_mul(d->t,&local_120,&local_a0);
  }
  return;
}

Assistant:

static DECAF_NOINLINE void
sub_niels_from_pt (
    point_t d,
    const niels_t e,
    int before_double
) {
    gf a, b, c;
    gf_sub_nr ( b, d->y, d->x ); /* 3+e */
    gf_mul ( a, e->b, b );
    gf_add_nr ( b, d->x, d->y ); /* 2+e */
    gf_mul ( d->y, e->a, b );
    gf_mul ( d->x, e->c, d->t );
    gf_add_nr ( c, a, d->y );    /* 2+e */
    gf_sub_nr ( b, d->y, a );    /* 3+e */
    gf_add_nr ( d->y, d->z, d->x ); /* 2+e */
    gf_sub_nr ( a, d->z, d->x ); /* 3+e */
    gf_mul ( d->z, a, d->y );
    gf_mul ( d->x, d->y, b );
    gf_mul ( d->y, a, c );
    if (!before_double) gf_mul ( d->t, b, c );
}